

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

int t32_expandimm_imm(DisasContext_conflict1 *s,int x)

{
  uint uVar1;
  
  uVar1 = (uint)s & 0xff;
  switch((uint)((ulong)s >> 8) & 0xf) {
  case 0:
    break;
  case 1:
    return uVar1 * 0x10001;
  case 2:
    return uVar1 * 0x1000100;
  case 3:
    return uVar1 * 0x1010101;
  default:
    uVar1 = uVar1 | 0x80;
  }
  return uVar1;
}

Assistant:

static inline uint32_t extract32(uint32_t value, int start, int length)
{
    assert(start >= 0 && length > 0 && length <= 32 - start);
    return (value >> start) & (~0U >> (32 - length));
}